

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mock_gl_engine.cpp
# Opt level: O0

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
polyscope::render::backend_openGL_mock::GLFrameBuffer::readBuffer(GLFrameBuffer *this)

{
  size_type __n;
  FrameBuffer *in_RSI;
  allocator_type *in_RDI;
  size_t buffSize;
  int h;
  int w;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *buff;
  allocator_type *__a;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_22;
  
  __a = in_RDI;
  (*in_RSI->_vptr_FrameBuffer[2])();
  local_22.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._14_4_ = FrameBuffer::getSizeX(in_RSI);
  local_22.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish._2_4_ = FrameBuffer::getSizeY(in_RSI);
  __n = (size_type)
        (int)(local_22.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._14_4_ *
              local_22.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish._2_4_ * 4);
  local_22.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._1_1_ = 0;
  this_00 = &local_22;
  local_22.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._2_8_ = __n;
  geometrycentral::surface::std::allocator<unsigned_char>::allocator
            ((allocator<unsigned_char> *)0x3fcb0d);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(this_00,__n,__a);
  geometrycentral::surface::std::allocator<unsigned_char>::~allocator
            ((allocator<unsigned_char> *)0x3fcb2d);
  return (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_RDI;
}

Assistant:

std::vector<unsigned char> GLFrameBuffer::readBuffer() {
  bind();

  int w = getSizeX();
  int h = getSizeY();

  // Read from openGL
  size_t buffSize = w * h * 4;
  std::vector<unsigned char> buff(buffSize);

  return buff;
}